

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testCopyMultiPartFile.cpp
# Opt level: O0

bool anon_unknown.dwarf_1ab374::checkPixels<unsigned_int>
               (Array2D<unsigned_int> *ph,int width,int height)

{
  bool bVar1;
  int in_ESI;
  undefined8 in_RDI;
  int unaff_retaddr;
  int unaff_retaddr_00;
  
  bVar1 = checkPixels<unsigned_int>
                    ((Array2D<unsigned_int> *)CONCAT44(width,height),unaff_retaddr_00,unaff_retaddr,
                     (int)((ulong)in_RDI >> 0x20),(int)in_RDI,in_ESI);
  return bVar1;
}

Assistant:

bool
checkPixels (Array2D<T>& ph, int width, int height)
{
    return checkPixels<T> (ph, 0, width - 1, 0, height - 1, width);
}